

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  string *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tuple;
  char_data **in_stack_fffffffffffffe58;
  value_type *__x;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe60;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffe68;
  anon_class_48_3_3bdf3dc2 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe70;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  CLogger *in_stack_fffffffffffffea8;
  undefined5 in_stack_fffffffffffffeb0;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 uVar3;
  string local_138 [32];
  int local_118;
  string local_110 [32];
  undefined1 local_f0 [56];
  undefined1 local_b8 [112];
  _Manager_type local_48;
  char *local_28;
  int local_c;
  
  local_28 = in_R8;
  local_c = in_ESI;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_48 = (_Manager_type)0x2;
    fmt._M_str = (char *)in_stack_fffffffffffffea8;
    fmt._M_len = (size_t)in_stack_fffffffffffffea0;
    CLogger::Warn<unsigned_long>((CLogger *)in_RDI,fmt,(unsigned_long *)in_RDX);
  }
  t = (tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)(local_b8 + 0x48);
  std::
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x798f55);
  GetCharacterData<char_data*&,std::__cxx11::string>((CQueue *)in_RCX,t);
  local_118 = local_c;
  args_1_00 = in_RDI;
  std::__cxx11::string::string(local_110,in_RDX);
  uVar1 = 1;
  __f = (anon_class_48_3_3bdf3dc2 *)local_f0;
  std::__cxx11::string::string((string *)__f,in_RCX);
  this_00 = (queueEntry_t *)(local_f0 + 0x20);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(1,CONCAT15(uVar1,in_stack_fffffffffffffeb0))),
             (vector<char_data_*,_std::allocator<char_data_*>_> *)in_stack_fffffffffffffea8);
  __x = (value_type *)local_b8;
  std::__cxx11::string::string(local_138,in_stack_00000008);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&&)::_lambda()_1_,void>
            ((function<void_()> *)in_RDI,__f);
  uVar3 = 0;
  uVar2 = 0;
  uVar1 = 0;
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,__x);
  queueEntry_t::~queueEntry_t(this_00);
  AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&&)
  ::{lambda()#1}::~AddToQueue((anon_class_48_3_3bdf3dc2 *)0x79906a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__f);
  fmt_00._M_len._5_1_ = uVar1;
  fmt_00._M_len._0_5_ = in_stack_fffffffffffffeb0;
  fmt_00._M_len._6_1_ = uVar2;
  fmt_00._M_len._7_1_ = uVar3;
  fmt_00._M_str = local_28;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            (in_stack_fffffffffffffea8,fmt_00,in_stack_fffffffffffffea0,args_1_00,(int *)in_RDX);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDI);
  std::
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x7990bf);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}